

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

int utf8ncmp(void *src1,void *src2,size_t n)

{
  bool bVar1;
  uchar *s2;
  uchar *s1;
  size_t n_local;
  void *src2_local;
  void *src1_local;
  
  s2 = (uchar *)src2;
  s1 = (uchar *)src1;
  n_local = n;
  while( true ) {
    if ((*s1 != '\0') || (bVar1 = false, *s2 != '\0')) {
      bVar1 = n_local != 0;
      n_local = n_local - 1;
    }
    if (!bVar1) {
      return 0;
    }
    if (*s1 < *s2) {
      return -1;
    }
    if (*s2 < *s1) break;
    s1 = s1 + 1;
    s2 = s2 + 1;
  }
  return 1;
}

Assistant:

int utf8ncmp(const void *src1, const void *src2, size_t n) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while ((('\0' != *s1) || ('\0' != *s2)) && (0 != n--)) {
    if (*s1 < *s2) {
      return -1;
    } else if (*s1 > *s2) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}